

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableModel::clear(QTableModel *this)

{
  QTableWidgetItem **ppQVar1;
  QTableWidgetItem *pQVar2;
  pointer ppQVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (this->verticalHeaderItems).d.size;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      ppQVar1 = (this->verticalHeaderItems).d.ptr;
      pQVar2 = ppQVar1[uVar5];
      if (pQVar2 != (QTableWidgetItem *)0x0) {
        pQVar2->view = (QTableWidget *)0x0;
        pQVar2 = ppQVar1[uVar5];
        if (pQVar2 != (QTableWidgetItem *)0x0) {
          (*pQVar2->_vptr_QTableWidgetItem[1])();
        }
        ppQVar3 = QList<QTableWidgetItem_*>::data(&this->verticalHeaderItems);
        ppQVar3[uVar5] = (QTableWidgetItem *)0x0;
        uVar4 = (this->verticalHeaderItems).d.size;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  uVar4 = (this->horizontalHeaderItems).d.size;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      ppQVar1 = (this->horizontalHeaderItems).d.ptr;
      pQVar2 = ppQVar1[uVar5];
      if (pQVar2 != (QTableWidgetItem *)0x0) {
        pQVar2->view = (QTableWidget *)0x0;
        pQVar2 = ppQVar1[uVar5];
        if (pQVar2 != (QTableWidgetItem *)0x0) {
          (*pQVar2->_vptr_QTableWidgetItem[1])();
        }
        ppQVar3 = QList<QTableWidgetItem_*>::data(&this->horizontalHeaderItems);
        ppQVar3[uVar5] = (QTableWidgetItem *)0x0;
        uVar4 = (this->horizontalHeaderItems).d.size;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  clearContents(this);
  return;
}

Assistant:

void QTableModel::clear()
{
    for (int j = 0; j < verticalHeaderItems.size(); ++j) {
        if (verticalHeaderItems.at(j)) {
            verticalHeaderItems.at(j)->view = nullptr;
            delete verticalHeaderItems.at(j);
            verticalHeaderItems[j] = 0;
        }
    }
    for (int k = 0; k < horizontalHeaderItems.size(); ++k) {
        if (horizontalHeaderItems.at(k)) {
            horizontalHeaderItems.at(k)->view = nullptr;
            delete horizontalHeaderItems.at(k);
            horizontalHeaderItems[k] = 0;
        }
    }
    clearContents();
}